

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conway-cubes.cpp
# Opt level: O0

object_t<2UL,_char> *
make<2ul,char>(object_t<2UL,_char> *__return_storage_ptr__,size_t N,char *value)

{
  allocator<std::vector<char,_std::allocator<char>_>_> local_39;
  object_t<1UL,_char> local_38;
  char *local_20;
  char *value_local;
  size_t N_local;
  
  local_20 = value;
  value_local = (char *)N;
  N_local = (size_t)__return_storage_ptr__;
  make<1ul,char>(&local_38,N,value);
  std::allocator<std::vector<char,_std::allocator<char>_>_>::allocator(&local_39);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,N,&local_38,&local_39);
  std::allocator<std::vector<char,_std::allocator<char>_>_>::~allocator(&local_39);
  std::vector<char,_std::allocator<char>_>::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

auto make(size_t N, const T& value) {
  if constexpr (Dim > 1) {
    return object_t<Dim, T>(N, make<Dim-1, T>(N, value));
  } else {
    return object_t<Dim, T>(N, value);
  }
}